

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  SPxOut *pSVar1;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  type_conflict5 tVar3;
  bool bVar4;
  int iVar5;
  Verbosity VVar6;
  ulong *puVar7;
  int *piVar8;
  element_type *this_00;
  int __c;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real eps;
  Verbosity old_verbosity_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  int row_j;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  int i_1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  absBnd;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lo;
  int j;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int i;
  int objCnt;
  int chgLRhs;
  int chgBnds;
  int remNzos;
  int remRows;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  tol;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_6;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_7;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_5;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_4;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe768;
  uint in_stack_ffffffffffffe770;
  uint in_stack_ffffffffffffe774;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe778;
  uint in_stack_ffffffffffffe780;
  uint in_stack_ffffffffffffe784;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe788;
  bool local_1869;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7a8;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffe7b8;
  int in_stack_ffffffffffffe7c4;
  uint uVar9;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7c8;
  FreeConstraintPS *in_stack_ffffffffffffe7d0;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7d8;
  uint in_stack_ffffffffffffe7e0;
  uint in_stack_ffffffffffffe7e4;
  uint in_stack_ffffffffffffe7f0;
  uint in_stack_ffffffffffffe7f4;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffe7f8;
  bool local_17f9;
  type_conflict5 local_17e9;
  type_conflict5 local_17d9;
  bool local_17c5;
  type_conflict5 local_1781;
  type_conflict5 local_1771;
  type_conflict5 local_1761;
  bool local_1751;
  type_conflict5 local_1741;
  type_conflict5 local_1731;
  bool local_1721;
  undefined4 local_1718;
  Verbosity local_1714;
  undefined1 local_1710 [56];
  undefined1 local_16d8 [56];
  ulong local_16a0;
  undefined1 local_1698 [56];
  undefined1 local_1660 [56];
  ulong local_1628;
  undefined1 local_1620 [56];
  undefined8 local_15e8;
  undefined1 local_15e0 [112];
  undefined1 local_1570 [56];
  undefined8 local_1538;
  undefined1 local_152c [56];
  undefined1 local_14f4 [56];
  undefined4 local_14bc;
  Verbosity local_14b8;
  undefined1 local_14b4 [56];
  undefined1 local_147c [56];
  undefined1 local_1444 [56];
  undefined4 local_140c;
  Verbosity local_1408;
  uint local_1404;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1400;
  undefined1 local_13f4 [56];
  undefined1 local_13bc [56];
  undefined1 local_1384 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_134c;
  uint local_1314;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1310;
  undefined8 local_1308;
  undefined8 local_1300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12f8;
  undefined1 local_12c0 [56];
  undefined1 local_1288 [56];
  undefined1 local_1250 [56];
  undefined1 local_1218 [72];
  undefined1 local_11d0 [56];
  undefined1 local_1198 [56];
  undefined1 local_1160 [56];
  undefined1 local_1128 [56];
  ulong local_10f0;
  undefined1 local_10e8 [56];
  undefined1 local_10b0 [56];
  ulong local_1078;
  undefined1 local_1070 [56];
  undefined8 local_1038;
  undefined1 local_1030 [112];
  undefined1 local_fc0 [56];
  undefined8 local_f88;
  undefined1 local_f80 [56];
  undefined1 local_f48 [56];
  undefined1 local_f10 [56];
  ulong local_ed8;
  undefined1 local_ed0 [56];
  undefined1 local_e98 [56];
  ulong local_e60;
  undefined1 local_e58 [56];
  undefined8 local_e20;
  undefined1 local_e18 [112];
  undefined1 local_da8 [56];
  undefined8 local_d70;
  undefined1 local_d64 [56];
  uint local_d2c;
  undefined1 local_d25;
  undefined1 local_cf8 [56];
  ulong local_cc0;
  undefined1 local_cb8 [56];
  undefined1 local_c80 [56];
  undefined1 local_c48 [56];
  ulong local_c10;
  undefined1 local_c08 [56];
  undefined1 local_bd0 [56];
  ulong local_b98;
  undefined1 local_b90 [56];
  undefined8 local_b58;
  undefined1 local_b50 [112];
  undefined1 local_ae0 [56];
  undefined8 local_aa8;
  undefined1 local_aa0 [56];
  undefined1 local_a68 [56];
  undefined1 local_a30 [56];
  ulong local_9f8;
  undefined1 local_9f0 [56];
  undefined1 local_9b8 [56];
  ulong local_980;
  undefined1 local_978 [56];
  undefined8 local_940;
  undefined1 local_938 [112];
  undefined1 local_8c8 [56];
  undefined8 local_890;
  undefined1 local_888 [56];
  uint local_850;
  int local_84c;
  int local_848;
  int local_844;
  int local_840;
  int local_83c;
  undefined1 local_800 [56];
  undefined8 local_7c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7c0;
  undefined1 local_788 [56];
  undefined8 local_750;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_748;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_710;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6d8;
  undefined8 local_6c8;
  undefined8 local_6c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_6b8;
  undefined8 local_6b0;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  undefined8 local_698;
  ulong *local_690;
  undefined1 *local_688;
  undefined8 local_680;
  ulong *local_678;
  undefined1 *local_670;
  undefined8 local_668;
  undefined8 local_660;
  undefined1 *local_658;
  undefined8 local_650;
  undefined8 local_648;
  undefined1 *local_640;
  undefined8 local_638;
  undefined8 *local_630;
  undefined1 *local_628;
  undefined8 local_620;
  ulong *local_618;
  undefined1 *local_610;
  undefined8 local_608;
  ulong *local_600;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined8 local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined1 *local_5c8;
  undefined8 local_5c0;
  ulong *local_5b8;
  undefined1 *local_5b0;
  undefined8 local_5a8;
  undefined8 local_5a0;
  undefined1 *local_598;
  undefined8 local_590;
  undefined8 *local_588;
  undefined1 *local_580;
  undefined8 local_578;
  ulong *local_570;
  undefined1 *local_568;
  undefined8 local_560;
  ulong *local_558;
  undefined1 *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined1 *local_538;
  undefined8 local_530;
  undefined8 local_528;
  undefined1 *local_520;
  undefined8 local_518;
  undefined8 *local_510;
  undefined1 *local_508;
  undefined8 local_500;
  ulong *local_4f8;
  undefined1 *local_4f0;
  undefined8 local_4e8;
  ulong *local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined1 *local_4a8;
  undefined8 local_4a0;
  undefined8 *local_498;
  undefined1 *local_490;
  undefined8 local_488;
  ulong *local_480;
  undefined1 *local_478;
  undefined8 local_470;
  ulong *local_468;
  undefined1 *local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined1 *local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_328;
  undefined1 *local_320;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  undefined8 local_2a8;
  undefined8 local_2a0;
  ulong *local_298;
  ulong *local_290;
  undefined8 *local_288;
  undefined8 local_280;
  undefined8 local_278;
  ulong *local_270;
  ulong *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 local_250;
  ulong *local_248;
  ulong *local_240;
  undefined8 *local_238;
  undefined8 local_230;
  ulong *local_228;
  undefined8 local_220;
  undefined8 local_218;
  ulong *local_210;
  ulong *local_208;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  ulong *local_1e8;
  ulong *local_1e0;
  undefined8 *local_1d8;
  undefined8 local_1d0;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_1c1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined1 *local_190;
  undefined8 *local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  undefined8 *local_178;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_169;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_139;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_138;
  undefined1 *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_109;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_d9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  undefined8 *local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  undefined8 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_6d8 = in_RSI;
  local_6c0 = infinity();
  local_6b8 = &local_748;
  local_6c8 = 0;
  local_1d0 = local_6c0;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
             (double)in_stack_ffffffffffffe778,
             (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
  local_750 = 0x4014000000000000;
  local_68 = &local_710;
  local_70 = &local_748;
  local_78 = &local_750;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_79,local_70);
  local_60 = &local_710;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
  local_50 = &local_710;
  local_58 = local_70;
  local_48 = local_78;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768,(double *)0x3fe4cd);
  feastol(in_stack_ffffffffffffe7a8);
  local_7c8 = 0x3f847ae147ae147b;
  local_28 = local_788;
  local_30 = &local_7c0;
  local_38 = &local_7c8;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_39,local_30);
  local_20 = local_788;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
  local_10 = local_788;
  local_18 = local_30;
  local_8 = local_38;
  boost::multiprecision::default_ops::
  eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768,(double *)0x3fe5a2);
  epsZero(in_stack_ffffffffffffe7a8);
  tVar3 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_ffffffffffffe768,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)0x3fe5cc);
  if (tVar3) {
    epsZero(in_stack_ffffffffffffe7a8);
  }
  else {
    local_420 = local_800;
    local_428 = local_788;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
  }
  local_2b0 = local_788;
  local_2b8 = local_800;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            ((cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
             (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
  local_83c = 0;
  local_840 = 0;
  local_844 = 0;
  local_848 = 0;
  local_84c = 0;
  local_850 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3fe697);
  while (local_850 = local_850 - 1, -1 < (int)local_850) {
    local_418 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                      (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
    local_410 = local_888;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
    local_890 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe768,(double *)0x3fe711);
    local_1721 = false;
    if (tVar3) {
      local_400 = local_8c8;
      local_408 = local_888;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      epsZero(in_stack_ffffffffffffe7a8);
      local_1721 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffe7d8);
    }
    pSVar2 = local_6d8;
    uVar9 = local_850;
    if (local_1721 == false) {
      puVar7 = (ulong *)infinity();
      local_980 = *puVar7 ^ 0x8000000000000000;
      local_688 = local_978;
      local_690 = &local_980;
      local_698 = 0;
      local_1e0 = local_690;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3fe8eb);
      local_1731 = false;
      if (tVar3) {
        local_a0 = local_9b8;
        local_a8 = &local_710;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_a9,local_a8);
        local_90 = local_9b8;
        local_98 = local_a8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        local_88 = local_9b8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        local_1731 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffe768,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x3fe99c);
      }
      pSVar2 = local_6d8;
      uVar9 = local_850;
      if (local_1731 == false) {
        local_660 = infinity();
        local_658 = local_a30;
        local_668 = 0;
        local_1f0 = local_660;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3feaf6);
        local_1741 = false;
        if (tVar3) {
          local_1741 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffe768,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x3feb1d);
        }
        pSVar2 = local_6d8;
        uVar9 = local_850;
        if (local_1741 != false) {
          local_648 = infinity();
          local_640 = local_a68;
          local_650 = 0;
          local_1f8 = local_648;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                     (double)in_stack_ffffffffffffe778,
                     (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
          (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&pSVar2->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(pSVar2,(ulong)uVar9,local_a68,0);
          local_848 = local_848 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_9f8 = *puVar7 ^ 0x8000000000000000;
        local_670 = local_9f0;
        local_678 = &local_9f8;
        local_680 = 0;
        local_1e8 = local_678;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x33])(pSVar2,(ulong)uVar9,local_9f0,0);
        local_848 = local_848 + 1;
      }
    }
    else {
      local_940 = 0;
      local_6a0 = local_938;
      local_6a8 = &local_940;
      local_6b0 = 0;
      local_1d8 = local_6a8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )->
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x33])(pSVar2,(ulong)uVar9,local_938,0);
      local_848 = local_848 + 1;
    }
    local_3f8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                      (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
    local_3f0 = local_aa0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
    local_aa8 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe768,(double *)0x3fec41);
    local_1751 = false;
    if (tVar3) {
      local_3e0 = local_ae0;
      local_3e8 = local_aa0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      epsZero(in_stack_ffffffffffffe7a8);
      local_1751 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffe7d8);
    }
    pSVar2 = local_6d8;
    uVar9 = local_850;
    if (local_1751 == false) {
      puVar7 = (ulong *)infinity();
      local_b98 = *puVar7 ^ 0x8000000000000000;
      local_610 = local_b90;
      local_618 = &local_b98;
      local_620 = 0;
      local_208 = local_618;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3fee1b);
      local_1761 = false;
      if (tVar3) {
        local_d0 = local_bd0;
        local_d8 = &local_710;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_d9,local_d8);
        local_c0 = local_bd0;
        local_c8 = local_d8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        local_b8 = local_bd0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        local_1761 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffe768,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x3feecc);
      }
      pSVar2 = local_6d8;
      uVar9 = local_850;
      if (local_1761 == false) {
        local_5e8 = infinity();
        local_5e0 = local_c48;
        local_5f0 = 0;
        local_218 = local_5e8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3ff026);
        local_1771 = false;
        if (tVar3) {
          local_1771 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffe768,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x3ff04d);
        }
        pSVar2 = local_6d8;
        uVar9 = local_850;
        if (local_1771 != false) {
          local_5d0 = infinity();
          local_5c8 = local_c80;
          local_5d8 = 0;
          local_220 = local_5d0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                     (double)in_stack_ffffffffffffe778,
                     (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
          (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&pSVar2->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x36])(pSVar2,(ulong)uVar9,local_c80,0);
          local_848 = local_848 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_c10 = *puVar7 ^ 0x8000000000000000;
        local_5f8 = local_c08;
        local_600 = &local_c10;
        local_608 = 0;
        local_210 = local_600;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x36])(pSVar2,(ulong)uVar9,local_c08,0);
        local_848 = local_848 + 1;
      }
    }
    else {
      local_b58 = 0;
      local_628 = local_b50;
      local_630 = &local_b58;
      local_638 = 0;
      local_200 = local_630;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )->
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x36])(pSVar2,(ulong)uVar9,local_b50,0);
      local_848 = local_848 + 1;
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
          (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
    puVar7 = (ulong *)infinity();
    local_cc0 = *puVar7 ^ 0x8000000000000000;
    local_5b0 = local_cb8;
    local_5b8 = &local_cc0;
    local_5c0 = 0;
    local_228 = local_5b8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
               (double)in_stack_ffffffffffffe778,
               (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
    tVar3 = boost::multiprecision::operator<=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe768,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x3ff1c2);
    local_1781 = false;
    if (tVar3) {
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
            (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      local_5a0 = infinity();
      local_598 = local_cf8;
      local_5a8 = 0;
      local_230 = local_5a0;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      local_1781 = boost::multiprecision::operator>=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffe768,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)0x3ff25e);
    }
    if (local_1781 != false) {
      operator_new(0x88);
      local_d25 = 1;
      std::shared_ptr<soplex::Tolerances>::shared_ptr
                ((shared_ptr<soplex::Tolerances> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffe768);
      FreeConstraintPS::FreeConstraintPS
                (in_stack_ffffffffffffe7d0,in_stack_ffffffffffffe7c8,in_stack_ffffffffffffe7c4,
                 in_stack_ffffffffffffe7b8);
      local_d25 = 0;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep>
      ::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS,void>
                ((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                  *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (FreeConstraintPS *)in_stack_ffffffffffffe768);
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3ff32b);
      Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
      ::append((Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                *)in_stack_ffffffffffffe768);
      removeRow((SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_ffffffffffffe778,in_stack_ffffffffffffe774);
      local_83c = local_83c + 1;
      piVar8 = DataArray<int>::operator[](&in_RDI->m_stat,1);
      *piVar8 = *piVar8 + 1;
      std::
      shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
      ::~shared_ptr((shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)0x3ff3a5);
    }
  }
  for (local_d2c = 0; uVar9 = local_d2c,
      iVar5 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3ff44f), (int)uVar9 < iVar5; local_d2c = local_d2c + 1) {
    local_3d8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::lower((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                        (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
    local_3d0 = local_d64;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
    local_d70 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe768,(double *)0x3ff4c2);
    local_17c5 = false;
    if (tVar3) {
      local_3c0 = local_da8;
      local_3c8 = local_d64;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      epsZero(in_stack_ffffffffffffe7a8);
      local_17c5 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffe7d8);
    }
    pSVar2 = local_6d8;
    uVar9 = local_d2c;
    if (local_17c5 == false) {
      puVar7 = (ulong *)infinity();
      local_e60 = *puVar7 ^ 0x8000000000000000;
      local_568 = local_e58;
      local_570 = &local_e60;
      local_578 = 0;
      local_240 = local_570;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3ff69c);
      local_17d9 = false;
      if (tVar3) {
        local_100 = local_e98;
        local_108 = &local_710;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_109,local_108);
        local_f0 = local_e98;
        local_f8 = local_108;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        local_e8 = local_e98;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        local_17d9 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)in_stack_ffffffffffffe768,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)0x3ff74d);
      }
      pSVar2 = local_6d8;
      uVar9 = local_d2c;
      if (local_17d9 == false) {
        local_540 = infinity();
        local_538 = local_f10;
        local_548 = 0;
        local_250 = local_540;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3ff8a7);
        local_17e9 = false;
        if (tVar3) {
          local_17e9 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)in_stack_ffffffffffffe768,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)0x3ff8ce);
        }
        pSVar2 = local_6d8;
        uVar9 = local_d2c;
        if (local_17e9 != false) {
          local_528 = infinity();
          local_520 = local_f48;
          local_530 = 0;
          local_258 = local_528;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                     (double)in_stack_ffffffffffffe778,
                     (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
          (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&pSVar2->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x2a])(pSVar2,(ulong)uVar9,local_f48,0);
          local_844 = local_844 + 1;
        }
      }
      else {
        puVar7 = (ulong *)infinity();
        local_ed8 = *puVar7 ^ 0x8000000000000000;
        local_550 = local_ed0;
        local_558 = &local_ed8;
        local_560 = 0;
        local_248 = local_558;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])(pSVar2,(ulong)uVar9,local_ed0,0);
        local_844 = local_844 + 1;
      }
    }
    else {
      local_e20 = 0;
      local_580 = local_e18;
      local_588 = &local_e20;
      local_590 = 0;
      local_238 = local_588;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&pSVar2->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )->
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2a])(pSVar2,(ulong)uVar9,local_e18,0);
      local_844 = local_844 + 1;
    }
    local_3b8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::upper((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                        (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
    local_3b0 = local_f80;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
    local_f88 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe768,(double *)0x3ff9f2);
    local_17f9 = false;
    if (tVar3) {
      local_3a0 = local_fc0;
      local_3a8 = local_f80;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      epsZero(in_stack_ffffffffffffe7a8);
      local_17f9 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffe7d8);
    }
    uVar9 = local_d2c;
    if (local_17f9 == false) {
      puVar7 = (ulong *)infinity();
      local_1078 = *puVar7 ^ 0x8000000000000000;
      local_4f0 = local_1070;
      local_4f8 = &local_1078;
      local_500 = 0;
      local_268 = local_4f8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x3ffbcc);
      in_stack_ffffffffffffe7f4 = in_stack_ffffffffffffe7f4 & 0xffffff;
      if (tVar3) {
        local_130 = local_10b0;
        local_138 = &local_710;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_139,local_138);
        local_120 = local_10b0;
        local_128 = local_138;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        local_118 = local_10b0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3ffc7d);
        in_stack_ffffffffffffe7f4 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffe7f4);
      }
      pSVar2 = local_6d8;
      if ((char)(in_stack_ffffffffffffe7f4 >> 0x18) == '\0') {
        local_4c8 = infinity();
        local_4c0 = local_1128;
        local_4d0 = 0;
        local_278 = local_4c8;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x3ffdd7);
        in_stack_ffffffffffffe7e4 = in_stack_ffffffffffffe7e4 & 0xffffff;
        if (tVar3) {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffe768,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x3ffdfb);
          in_stack_ffffffffffffe7e4 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffe7e4);
        }
        if ((char)(in_stack_ffffffffffffe7e4 >> 0x18) != '\0') {
          in_stack_ffffffffffffe7d8 = local_6d8;
          in_stack_ffffffffffffe7e0 = local_d2c;
          local_4b0 = infinity();
          local_4a8 = local_1160;
          local_4b8 = 0;
          local_280 = local_4b0;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                     (double)in_stack_ffffffffffffe778,
                     (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
          (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&in_stack_ffffffffffffe7d8->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x2d])
                    (in_stack_ffffffffffffe7d8,(ulong)in_stack_ffffffffffffe7e0,local_1160,0);
          local_844 = local_844 + 1;
        }
      }
      else {
        in_stack_ffffffffffffe7f0 = local_d2c;
        puVar7 = (ulong *)infinity();
        local_10f0 = *puVar7 ^ 0x8000000000000000;
        local_4d8 = local_10e8;
        local_4e0 = &local_10f0;
        local_4e8 = 0;
        local_270 = local_4e0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&pSVar2->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2d])(pSVar2,(ulong)in_stack_ffffffffffffe7f0,local_10e8,0);
        local_844 = local_844 + 1;
      }
    }
    else {
      local_1038 = 0;
      local_508 = local_1030;
      local_510 = &local_1038;
      local_518 = 0;
      in_stack_ffffffffffffe7f8 = local_6d8;
      local_260 = local_510;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&in_stack_ffffffffffffe7f8->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )->
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(in_stack_ffffffffffffe7f8,(ulong)uVar9,local_1030,0);
      local_844 = local_844 + 1;
    }
    local_390 = local_1198;
    local_398 = local_d64;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
    local_380 = local_11d0;
    local_388 = local_f80;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
               (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
    SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::tolerances(&in_stack_ffffffffffffe768->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                );
    this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3fff39);
    eps = Tolerances::epsilon(this_00);
    bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe7d8,eps);
    uVar9 = (uint)bVar4 << 0x18;
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3fff77);
    if ((uVar9 & 0x1000000) != 0) {
      local_370 = local_1250;
      local_378 = local_d64;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffe768);
      local_2c0 = local_d64;
      local_2c8 = local_1218;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      local_360 = local_12c0;
      local_368 = local_f80;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_ffffffffffffe768);
      local_2d0 = local_f80;
      local_2d8 = local_1288;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x400097);
      if (tVar3) {
        local_358 = local_d64;
      }
      else {
        local_358 = local_f80;
      }
      local_350 = &local_12f8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      local_1300 = 0x3ff0000000000000;
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,(double *)0x400113);
      if (tVar3) {
        local_1308 = 0x3ff0000000000000;
        local_180 = &local_12f8;
        local_188 = &local_1308;
        local_178 = local_188;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe7f8,
                   (double)CONCAT44(in_stack_ffffffffffffe7f4,in_stack_ffffffffffffe7f0));
      }
      local_1310 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::colVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      local_1314 = 0;
      while (uVar9 = local_1314,
            iVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::size(local_1310), (int)uVar9 < iVar5) {
        local_348 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::value(local_1310,local_1314);
        local_340 = local_1384;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)in_stack_ffffffffffffe768);
        local_1b0 = local_13bc;
        local_1b8 = &local_134c;
        local_1c0 = &local_12f8;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_1c1,local_1b8,local_1c0);
        local_1a8 = local_13bc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        local_190 = local_13bc;
        local_198 = local_1b8;
        local_1a0 = local_1c0;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768,
                   (cpp_dec_float<50U,_int,_void> *)0x4002f8);
        local_330 = local_13f4;
        local_338 = local_788;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe7d8);
        if (bVar4) {
          in_stack_ffffffffffffe7a8 = local_6d8;
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::index(local_1310,(char *)(ulong)local_1314,__c);
          local_1400 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::rowVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770
                                                ),(int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
          local_1404 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)in_stack_ffffffffffffe778,in_stack_ffffffffffffe774);
          if (-1 < (int)local_1404) {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::remove(local_1400,(char *)(ulong)local_1404);
          }
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::remove(local_1310,(char *)(ulong)local_1314);
          SPxOut::
          debug<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[38],_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_&,_0>
                    (in_RDI,(char (*) [38])"IMAISM04 aij={}  removed, absBnd={} \n",&local_134c,
                     &local_12f8);
          local_840 = local_840 + 1;
        }
        else {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffe768,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x40041c);
          if (tVar3) {
            if (((in_RDI->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout != (SPxOut *)0x0) &&
               (VVar6 = SPxOut::getVerbosity
                                  ((in_RDI->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout), 0 < (int)VVar6)) {
              local_1408 = SPxOut::getVerbosity
                                     ((in_RDI->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).spxout);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              local_140c = 1;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_140c);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (char *)in_stack_ffffffffffffe768);
              local_320 = local_1444;
              local_328 = &local_134c;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe768);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffe768);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_1408);
            }
          }
          else {
            local_310 = local_147c;
            local_318 = &local_134c;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                       (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
            local_300 = local_14b4;
            local_308 = local_788;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                       (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
            bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_ffffffffffffe7d8);
            if (((bVar4) &&
                ((in_RDI->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout != (SPxOut *)0x0)) &&
               (VVar6 = SPxOut::getVerbosity
                                  ((in_RDI->
                                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).spxout), 0 < (int)VVar6)) {
              local_14b8 = SPxOut::getVerbosity
                                     ((in_RDI->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).spxout);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              local_14bc = 1;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_14bc);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (char *)in_stack_ffffffffffffe768);
              local_2f0 = local_14f4;
              local_2f8 = &local_134c;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)in_stack_ffffffffffffe768);
              soplex::operator<<((SPxOut *)
                                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                                 (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffe768);
              pSVar1 = (in_RDI->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_14b8);
            }
          }
          local_1314 = local_1314 + 1;
        }
      }
    }
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)in_stack_ffffffffffffe788,in_stack_ffffffffffffe784);
    local_1538 = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)in_stack_ffffffffffffe768,(double *)0x400731);
    local_1869 = false;
    if (tVar3) {
      local_2e0 = local_1570;
      local_2e8 = local_152c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                 (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
      epsZero(in_stack_ffffffffffffe7a8);
      local_1869 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)CONCAT44(in_stack_ffffffffffffe7e4,in_stack_ffffffffffffe7e0),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)in_stack_ffffffffffffe7d8);
    }
    uVar9 = local_d2c;
    if (local_1869 == false) {
      puVar7 = (ulong *)infinity();
      local_1628 = *puVar7 ^ 0x8000000000000000;
      local_478 = local_1620;
      local_480 = &local_1628;
      local_488 = 0;
      local_290 = local_480;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_ffffffffffffe768,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)0x4008f6);
      in_stack_ffffffffffffe784 = in_stack_ffffffffffffe784 & 0xffffff;
      if (tVar3) {
        local_160 = local_1660;
        local_168 = &local_710;
        boost::multiprecision::detail::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
        ::
        scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&local_169,local_168);
        local_150 = local_1660;
        local_158 = local_168;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                   (cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffe768);
        local_148 = local_1660;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x4009a4);
        in_stack_ffffffffffffe784 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffe784);
      }
      if ((char)(in_stack_ffffffffffffe784 >> 0x18) == '\0') {
        local_450 = infinity();
        local_448 = local_16d8;
        local_458 = 0;
        local_2a0 = local_450;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_ffffffffffffe768,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x400aec);
        in_stack_ffffffffffffe774 = in_stack_ffffffffffffe774 & 0xffffff;
        if (tVar3) {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_ffffffffffffe768,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x400b10);
          in_stack_ffffffffffffe774 = CONCAT13(tVar3,(int3)in_stack_ffffffffffffe774);
        }
        if ((char)(in_stack_ffffffffffffe774 >> 0x18) != '\0') {
          in_stack_ffffffffffffe768 = local_6d8;
          in_stack_ffffffffffffe770 = local_d2c;
          local_438 = infinity();
          local_430 = local_1710;
          local_440 = 0;
          local_2a8 = local_438;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                     (double)in_stack_ffffffffffffe778,
                     (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
          (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)&in_stack_ffffffffffffe768->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x24])
                    (in_stack_ffffffffffffe768,(ulong)in_stack_ffffffffffffe770,local_1710,0);
          local_84c = local_84c + 1;
        }
      }
      else {
        in_stack_ffffffffffffe778 = local_6d8;
        in_stack_ffffffffffffe780 = local_d2c;
        puVar7 = (ulong *)infinity();
        local_16a0 = *puVar7 ^ 0x8000000000000000;
        local_460 = local_1698;
        local_468 = &local_16a0;
        local_470 = 0;
        local_298 = local_468;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                   (double)in_stack_ffffffffffffe778,
                   (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
        (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)&in_stack_ffffffffffffe778->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x24])
                  (in_stack_ffffffffffffe778,(ulong)in_stack_ffffffffffffe780,local_1698,0);
        local_84c = local_84c + 1;
      }
    }
    else {
      local_15e8 = 0;
      local_490 = local_15e0;
      local_498 = &local_15e8;
      local_4a0 = 0;
      in_stack_ffffffffffffe788 = local_6d8;
      local_288 = local_498;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                 (double)in_stack_ffffffffffffe778,
                 (type *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770));
      (*(((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)&in_stack_ffffffffffffe788->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )->
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x24])(in_stack_ffffffffffffe788,(ulong)uVar9,local_15e0,0);
      local_84c = local_84c + 1;
    }
  }
  if (0 < local_83c + local_840 + local_848 + local_844 + local_84c) {
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_remRows = local_83c +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remRows;
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_remNzos = local_840 +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_remNzos;
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_chgLRhs = local_848 +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgLRhs;
    (in_RDI->
    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).m_chgBnds = local_844 +
                  (in_RDI->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_chgBnds;
    if (((in_RDI->
         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).spxout != (SPxOut *)0x0) &&
       (VVar6 = SPxOut::getVerbosity
                          ((in_RDI->
                           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).spxout), 3 < (int)VVar6)) {
      local_1714 = SPxOut::getVerbosity
                             ((in_RDI->
                              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).spxout);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      local_1718 = 4;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_1718);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (char *)in_stack_ffffffffffffe768);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (char *)in_stack_ffffffffffffe768);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (char *)in_stack_ffffffffffffe768);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (char *)in_stack_ffffffffffffe768);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (char *)in_stack_ffffffffffffe768);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (int)((ulong)in_stack_ffffffffffffe768 >> 0x20));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (char *)in_stack_ffffffffffffe768);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_ffffffffffffe774,in_stack_ffffffffffffe770),
                         (_func_ostream_ptr_ostream_ptr *)in_stack_ffffffffffffe768);
      pSVar1 = (in_RDI->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).spxout;
      (*pSVar1->_vptr_SPxOut[2])(pSVar1,&local_1714);
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}